

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

uint32_t FAudioMasteringVoice_GetChannelMask(FAudioMasteringVoice *voice,uint32_t *pChannelMask)

{
  *pChannelMask = voice->audio->mixFormat->dwChannelMask;
  return 0;
}

Assistant:

FAUDIOAPI uint32_t FAudioMasteringVoice_GetChannelMask(
	FAudioMasteringVoice *voice,
	uint32_t *pChannelMask
) {
	LOG_API_ENTER(voice->audio)
	FAudio_assert(voice->type == FAUDIO_VOICE_MASTER);
	FAudio_assert(voice->audio->mixFormat != NULL);
	FAudio_assert(pChannelMask != NULL);

	*pChannelMask = voice->audio->mixFormat->dwChannelMask;
	LOG_API_EXIT(voice->audio)
	return 0;
}